

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
int_writer<unsigned_long_long,fmt::v6::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,char **it)

{
  int iVar1;
  char *__dest;
  bool bVar2;
  long lVar3;
  undefined1 *puVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  ptrdiff_t _Num;
  size_t __n;
  undefined1 auStack_48 [48];
  
  uVar6 = *(ulong *)this;
  iVar1 = *(int *)(this + 8);
  __n = (size_t)iVar1;
  puVar4 = auStack_48 + __n;
  uVar7 = uVar6;
  if (99 < uVar6) {
    do {
      uVar6 = uVar7 / 100;
      *(undefined2 *)(puVar4 + -2) =
           *(undefined2 *)
            (basic_data<void>::digits + (ulong)(uint)((int)uVar7 + (int)uVar6 * -100) * 2);
      puVar4 = puVar4 + -2;
      bVar2 = 9999 < uVar7;
      uVar7 = uVar6;
    } while (bVar2);
  }
  __dest = *it;
  if (uVar6 < 10) {
    bVar5 = (byte)uVar6 | 0x30;
    lVar3 = -1;
  }
  else {
    puVar4[-1] = basic_data<void>::digits[(uVar6 * 2 & 0xffffffff) + 1];
    bVar5 = basic_data<void>::digits[uVar6 * 2 & 0x1fffffffe];
    lVar3 = -2;
  }
  puVar4[lVar3] = bVar5;
  if (iVar1 != 0) {
    memcpy(__dest,auStack_48,__n);
  }
  *it = __dest + __n;
  return;
}

Assistant:

void operator()(It&& it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }